

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verify_certificate_chain.cc
# Opt level: O1

LevelDetails * __thiscall
bssl::anon_unknown_12::ValidPolicyGraph::StartLevel
          (LevelDetails *__return_storage_ptr__,ValidPolicyGraph *this)

{
  _Rb_tree_node_base *__k;
  _Rb_tree_header *p_Var1;
  pointer *ppmVar2;
  pointer pmVar3;
  iterator __position;
  pointer pmVar4;
  _Base_ptr p_Var5;
  __aligned_membuf<std::pair<const_bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node>_>
  *p_Var6;
  vector<bssl::der::Input,std::allocator<bssl::der::Input>> *this_00;
  _Base_ptr p_Var7;
  long lVar8;
  ulong uVar9;
  pointer pmVar10;
  undefined8 *puVar11;
  _Rb_tree_header *p_Var12;
  ulong uVar13;
  _Link_type __x;
  _Link_type __x_00;
  ulong uVar14;
  pointer pmVar15;
  _Rb_tree<bssl::der::Input,_std::pair<const_bssl::der::Input,_std::vector<bssl::der::Input,_std::allocator<bssl::der::Input>_>_>,_std::_Select1st<std::pair<const_bssl::der::Input,_std::vector<bssl::der::Input,_std::allocator<bssl::der::Input>_>_>_>,_std::less<bssl::der::Input>,_std::allocator<std::pair<const_bssl::der::Input,_std::vector<bssl::der::Input,_std::allocator<bssl::der::Input>_>_>_>_>
  local_68;
  bool local_38;
  
  pmVar3 = (this->levels_).
           super__Vector_base<std::map<bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node,_std::less<bssl::der::Input>,_std::allocator<std::pair<const_bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node>_>_>,_std::allocator<std::map<bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node,_std::less<bssl::der::Input>,_std::allocator<std::pair<const_bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if ((this->levels_).
      super__Vector_base<std::map<bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node,_std::less<bssl::der::Input>,_std::allocator<std::pair<const_bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node>_>_>,_std::allocator<std::map<bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node,_std::less<bssl::der::Input>,_std::allocator<std::pair<const_bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start != pmVar3) {
    p_Var7 = pmVar3[-1]._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var12 = &pmVar3[-1]._M_t._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)p_Var7 != p_Var12) {
      do {
        if (*(char *)&p_Var7[2]._M_parent == '\0') {
          __k = p_Var7 + 1;
          this_00 = (vector<bssl::der::Input,std::allocator<bssl::der::Input>> *)
                    ::std::
                    map<bssl::der::Input,_std::vector<bssl::der::Input,_std::allocator<bssl::der::Input>_>,_std::less<bssl::der::Input>,_std::allocator<std::pair<const_bssl::der::Input,_std::vector<bssl::der::Input,_std::allocator<bssl::der::Input>_>_>_>_>
                    ::operator[](&(this->current_level_).expected_policy_map,(key_type *)__k);
          __position._M_current = *(Input **)(this_00 + 8);
          if (__position._M_current == *(Input **)(this_00 + 0x10)) {
            ::std::vector<bssl::der::Input,std::allocator<bssl::der::Input>>::
            _M_realloc_insert<bssl::der::Input_const&>(this_00,__position,(Input *)__k);
          }
          else {
            p_Var5 = p_Var7[1]._M_parent;
            ((__position._M_current)->data_).data_ = *(uchar **)__k;
            ((__position._M_current)->data_).size_ = (size_t)p_Var5;
            *(long *)(this_00 + 8) = *(long *)(this_00 + 8) + 0x10;
          }
        }
        p_Var7 = (_Base_ptr)::std::_Rb_tree_increment(p_Var7);
      } while ((_Rb_tree_header *)p_Var7 != p_Var12);
    }
  }
  p_Var12 = &(this->current_level_).expected_policy_map._M_t._M_impl.super__Rb_tree_header;
  ::std::_Rb_tree_header::_Rb_tree_header
            (&(__return_storage_ptr__->expected_policy_map)._M_t._M_impl.super__Rb_tree_header,
             p_Var12);
  __return_storage_ptr__->has_any_policy = (this->current_level_).has_any_policy;
  pmVar3 = (this->levels_).
           super__Vector_base<std::map<bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node,_std::less<bssl::der::Input>,_std::allocator<std::pair<const_bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node>_>_>,_std::allocator<std::map<bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node,_std::less<bssl::der::Input>,_std::allocator<std::pair<const_bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pmVar3 == (this->levels_).
                super__Vector_base<std::map<bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node,_std::less<bssl::der::Input>,_std::allocator<std::pair<const_bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node>_>_>,_std::allocator<std::map<bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node,_std::less<bssl::der::Input>,_std::allocator<std::pair<const_bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    pmVar4 = (this->levels_).
             super__Vector_base<std::map<bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node,_std::less<bssl::der::Input>,_std::allocator<std::pair<const_bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node>_>_>,_std::allocator<std::map<bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node,_std::less<bssl::der::Input>,_std::allocator<std::pair<const_bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((long)pmVar3 - (long)pmVar4 == 0x7fffffffffffffe0) {
      ::std::__throw_length_error("vector::_M_realloc_insert");
    }
    lVar8 = (long)pmVar3 - (long)pmVar4 >> 4;
    uVar14 = lVar8 * -0x5555555555555555;
    uVar9 = 1;
    if (pmVar3 != pmVar4) {
      uVar9 = uVar14;
    }
    uVar13 = uVar9 + uVar14;
    if (0x2aaaaaaaaaaaaa9 < uVar13) {
      uVar13 = 0x2aaaaaaaaaaaaaa;
    }
    if (CARRY8(uVar9,uVar14)) {
      uVar13 = 0x2aaaaaaaaaaaaaa;
    }
    if (uVar13 == 0) {
      pmVar10 = (pointer)0x0;
    }
    else {
      pmVar10 = (pointer)operator_new(uVar13 * 0x30);
    }
    puVar11 = (undefined8 *)((long)&(pmVar10->_M_t)._M_impl + lVar8 * 0x10);
    puVar11[2] = 0;
    puVar11[3] = 0;
    puVar11[4] = 0;
    puVar11[5] = 0;
    *puVar11 = 0;
    puVar11[1] = 0;
    puVar11[3] = puVar11 + 1;
    puVar11[4] = puVar11 + 1;
    puVar11[5] = 0;
    pmVar15 = pmVar10;
    if (pmVar3 != pmVar4) {
      __x = (_Link_type)&(pmVar4->_M_t)._M_impl.super__Rb_tree_header;
      do {
        __x_00 = __x;
        ::std::_Rb_tree_header::_Rb_tree_header
                  ((_Rb_tree_header *)((long)&(pmVar15->_M_t)._M_impl + 8),(_Rb_tree_header *)__x);
        ::std::
        _Rb_tree<bssl::der::Input,_std::pair<const_bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node>,_std::_Select1st<std::pair<const_bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node>_>,_std::less<bssl::der::Input>,_std::allocator<std::pair<const_bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node>_>_>
        ::_M_erase((_Rb_tree<bssl::der::Input,_std::pair<const_bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node>,_std::_Select1st<std::pair<const_bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node>_>,_std::less<bssl::der::Input>,_std::allocator<std::pair<const_bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node>_>_>
                    *)(__x->super__Rb_tree_node_base)._M_parent,__x_00);
        pmVar15 = pmVar15 + 1;
        p_Var6 = &__x->_M_storage;
        __x = (_Link_type)((long)(__x->_M_storage)._M_storage + 0x10);
      } while ((pointer)((long)p_Var6->_M_storage + 8) != pmVar3);
    }
    if (pmVar4 != (pointer)0x0) {
      operator_delete(pmVar4,(long)(this->levels_).
                                   super__Vector_base<std::map<bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node,_std::less<bssl::der::Input>,_std::allocator<std::pair<const_bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node>_>_>,_std::allocator<std::map<bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node,_std::less<bssl::der::Input>,_std::allocator<std::pair<const_bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node>_>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pmVar4
                     );
    }
    (this->levels_).
    super__Vector_base<std::map<bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node,_std::less<bssl::der::Input>,_std::allocator<std::pair<const_bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node>_>_>,_std::allocator<std::map<bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node,_std::less<bssl::der::Input>,_std::allocator<std::pair<const_bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = pmVar10;
    (this->levels_).
    super__Vector_base<std::map<bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node,_std::less<bssl::der::Input>,_std::allocator<std::pair<const_bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node>_>_>,_std::allocator<std::map<bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node,_std::less<bssl::der::Input>,_std::allocator<std::pair<const_bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = pmVar15 + 1;
    (this->levels_).
    super__Vector_base<std::map<bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node,_std::less<bssl::der::Input>,_std::allocator<std::pair<const_bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node>_>_>,_std::allocator<std::map<bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node,_std::less<bssl::der::Input>,_std::allocator<std::pair<const_bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = pmVar10 + uVar13;
  }
  else {
    p_Var1 = &(pmVar3->_M_t)._M_impl.super__Rb_tree_header;
    (pmVar3->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    (pmVar3->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
    (pmVar3->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
    (pmVar3->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
    *(undefined8 *)&(pmVar3->_M_t)._M_impl = 0;
    *(undefined8 *)&(pmVar3->_M_t)._M_impl.super__Rb_tree_header._M_header = 0;
    (pmVar3->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
    (pmVar3->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
    (pmVar3->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
    ppmVar2 = &(this->levels_).
               super__Vector_base<std::map<bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node,_std::less<bssl::der::Input>,_std::allocator<std::pair<const_bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node>_>_>,_std::allocator<std::map<bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node,_std::less<bssl::der::Input>,_std::allocator<std::pair<const_bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppmVar2 = *ppmVar2 + 1;
  }
  p_Var1 = &local_68._M_impl.super__Rb_tree_header;
  local_68._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_68._M_impl._0_8_ = 0;
  local_68._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_68._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_68._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_38 = false;
  local_68._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  local_68._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  ::std::
  _Rb_tree<bssl::der::Input,_std::pair<const_bssl::der::Input,_std::vector<bssl::der::Input,_std::allocator<bssl::der::Input>_>_>,_std::_Select1st<std::pair<const_bssl::der::Input,_std::vector<bssl::der::Input,_std::allocator<bssl::der::Input>_>_>_>,_std::less<bssl::der::Input>,_std::allocator<std::pair<const_bssl::der::Input,_std::vector<bssl::der::Input,_std::allocator<bssl::der::Input>_>_>_>_>
  ::clear((_Rb_tree<bssl::der::Input,_std::pair<const_bssl::der::Input,_std::vector<bssl::der::Input,_std::allocator<bssl::der::Input>_>_>,_std::_Select1st<std::pair<const_bssl::der::Input,_std::vector<bssl::der::Input,_std::allocator<bssl::der::Input>_>_>_>,_std::less<bssl::der::Input>,_std::allocator<std::pair<const_bssl::der::Input,_std::vector<bssl::der::Input,_std::allocator<bssl::der::Input>_>_>_>_>
           *)&this->current_level_);
  if (local_68._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
    (this->current_level_).expected_policy_map._M_t._M_impl.super__Rb_tree_header._M_header._M_color
         = local_68._M_impl.super__Rb_tree_header._M_header._M_color;
    (this->current_level_).expected_policy_map._M_t._M_impl.super__Rb_tree_header._M_header.
    _M_parent = local_68._M_impl.super__Rb_tree_header._M_header._M_parent;
    (this->current_level_).expected_policy_map._M_t._M_impl.super__Rb_tree_header._M_header._M_left
         = local_68._M_impl.super__Rb_tree_header._M_header._M_left;
    (this->current_level_).expected_policy_map._M_t._M_impl.super__Rb_tree_header._M_header._M_right
         = local_68._M_impl.super__Rb_tree_header._M_header._M_right;
    (local_68._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent = &p_Var12->_M_header;
    (this->current_level_).expected_policy_map._M_t._M_impl.super__Rb_tree_header._M_node_count =
         local_68._M_impl.super__Rb_tree_header._M_node_count;
    local_68._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_68._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_68._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
    local_68._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  }
  (this->current_level_).has_any_policy = local_38;
  ::std::
  _Rb_tree<bssl::der::Input,_std::pair<const_bssl::der::Input,_std::vector<bssl::der::Input,_std::allocator<bssl::der::Input>_>_>,_std::_Select1st<std::pair<const_bssl::der::Input,_std::vector<bssl::der::Input,_std::allocator<bssl::der::Input>_>_>_>,_std::less<bssl::der::Input>,_std::allocator<std::pair<const_bssl::der::Input,_std::vector<bssl::der::Input,_std::allocator<bssl::der::Input>_>_>_>_>
  ::~_Rb_tree(&local_68);
  return __return_storage_ptr__;
}

Assistant:

LevelDetails StartLevel() {
    // Finish building expected_policy_map for the previous level.
    if (!levels_.empty()) {
      for (const auto &[policy, node] : levels_.back()) {
        if (!node.mapped) {
          current_level_.expected_policy_map[policy].push_back(policy);
        }
      }
    }

    LevelDetails prev_level = std::move(current_level_);
    levels_.emplace_back();
    current_level_ = LevelDetails{};
    return prev_level;
  }